

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QMessageDialogOptions::CustomButton>::reallocateAndGrow
          (QArrayDataPointer<QMessageDialogOptions::CustomButton> *this,GrowthPosition where,
          qsizetype n,QArrayDataPointer<QMessageDialogOptions::CustomButton> *old)

{
  bool bVar1;
  QGenericArrayOps<QMessageDialogOptions::CustomButton> *this_00;
  CustomButton *b;
  long in_RCX;
  long in_RDX;
  long in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<QMessageDialogOptions::CustomButton> *unaff_retaddr;
  qsizetype toCopy;
  QArrayDataPointer<QMessageDialogOptions::CustomButton> dp;
  QArrayDataPointer<QMessageDialogOptions::CustomButton> *in_stack_ffffffffffffff88;
  CustomButton *in_stack_ffffffffffffff90;
  CustomButton *in_stack_ffffffffffffff98;
  QGenericArrayOps<QMessageDialogOptions::CustomButton> *in_stack_ffffffffffffffa0;
  Data *local_20;
  CustomButton *local_18;
  qsizetype n_00;
  
  n_00 = *(qsizetype *)(in_FS_OFFSET + 0x28);
  local_20 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_18 = (CustomButton *)&DAT_aaaaaaaaaaaaaaaa;
  allocateGrow(unaff_retaddr,n_00,0xaaaaaaaa);
  if (0 < in_RDX) {
    qt_noop();
  }
  if (*(long *)(in_RDI + 0x10) != 0) {
    bVar1 = needsDetach((QArrayDataPointer<QMessageDialogOptions::CustomButton> *)
                        in_stack_ffffffffffffff90);
    if ((bVar1) || (in_RCX != 0)) {
      this_00 = (QGenericArrayOps<QMessageDialogOptions::CustomButton> *)
                operator->((QArrayDataPointer<QMessageDialogOptions::CustomButton> *)&local_20);
      begin((QArrayDataPointer<QMessageDialogOptions::CustomButton> *)0x3ccd96);
      begin((QArrayDataPointer<QMessageDialogOptions::CustomButton> *)0x3ccda5);
      QtPrivate::QGenericArrayOps<QMessageDialogOptions::CustomButton>::copyAppend
                (this_00,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    }
    else {
      in_stack_ffffffffffffff90 =
           (CustomButton *)
           operator->((QArrayDataPointer<QMessageDialogOptions::CustomButton> *)&local_20);
      b = begin((QArrayDataPointer<QMessageDialogOptions::CustomButton> *)0x3ccddb);
      begin((QArrayDataPointer<QMessageDialogOptions::CustomButton> *)0x3ccdea);
      QtPrivate::QGenericArrayOps<QMessageDialogOptions::CustomButton>::moveAppend
                (in_stack_ffffffffffffffa0,b,in_stack_ffffffffffffff90);
    }
  }
  swap((QArrayDataPointer<QMessageDialogOptions::CustomButton> *)in_stack_ffffffffffffff90,
       in_stack_ffffffffffffff88);
  if (in_RCX != 0) {
    swap((QArrayDataPointer<QMessageDialogOptions::CustomButton> *)in_stack_ffffffffffffff90,
         in_stack_ffffffffffffff88);
  }
  ~QArrayDataPointer((QArrayDataPointer<QMessageDialogOptions::CustomButton> *)
                     in_stack_ffffffffffffff90);
  if (*(long *)(in_FS_OFFSET + 0x28) == n_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }